

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Repeat_Button.cxx
# Opt level: O2

int __thiscall Fl_Repeat_Button::handle(Fl_Repeat_Button *this,int event)

{
  int iVar1;
  int v;
  
  if ((uint)event < 0x10) {
    iVar1 = 0;
    if ((0xa004U >> (event & 0x1fU) & 1) == 0) {
      if ((0x22U >> (event & 0x1fU) & 1) == 0) goto LAB_0018bfaa;
      iVar1 = Fl::visible_focus();
      if (iVar1 != 0) {
        Fl::focus((Fl_Widget *)this);
      }
      iVar1 = Fl::event_inside((Fl_Widget *)this);
    }
    v = 0;
    if (((this->super_Fl_Button).super_Fl_Widget.flags_ & 1) == 0) {
      v = iVar1;
    }
    iVar1 = Fl_Button::value(&this->super_Fl_Button,v);
    if (iVar1 != 0) {
      if (v == 0) {
        Fl::remove_timeout(repeat_callback,this);
      }
      else {
        Fl::add_timeout(0.5,repeat_callback,this);
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
    }
    return 1;
  }
LAB_0018bfaa:
  iVar1 = Fl_Button::handle(&this->super_Fl_Button,event);
  return iVar1;
}

Assistant:

int Fl_Repeat_Button::handle(int event) {
  int newval;
  switch (event) {
  case FL_HIDE:
  case FL_DEACTIVATE:
  case FL_RELEASE:
    newval = 0; goto J1;
  case FL_PUSH:
  case FL_DRAG:
    if (Fl::visible_focus()) Fl::focus(this);
    newval = Fl::event_inside(this);
  J1:
    if (!active()) 
      newval = 0;
    if (value(newval)) {
      if (newval) {
	Fl::add_timeout(INITIALREPEAT,repeat_callback,this);
	do_callback();
      } else {
	Fl::remove_timeout(repeat_callback,this);
      }
    }
    return 1;
  default:
    return Fl_Button::handle(event);
  }
}